

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * kj::StringTree::concat<>(void)

{
  size_t sVar1;
  char *pos;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  StringTree *in_RDI;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  initializer_list<unsigned_long> local_88;
  Array<kj::StringTree::Branch> local_78;
  initializer_list<unsigned_long> local_50;
  String local_40;
  initializer_list<unsigned_long> local_28;
  undefined1 local_11;
  StringTree *result;
  
  local_11 = 0;
  StringTree(in_RDI);
  std::initializer_list<unsigned_long>::initializer_list(&local_28);
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)local_28._M_len;
  sVar1 = _::sum((_ *)local_28._M_array,nums);
  in_RDI->size_ = sVar1;
  std::initializer_list<unsigned_long>::initializer_list(&local_50);
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)local_50._M_len;
  sVar1 = _::sum((_ *)local_50._M_array,nums_00);
  heapString(&local_40,sVar1);
  String::operator=(&in_RDI->text,&local_40);
  String::~String(&local_40);
  std::initializer_list<unsigned_long>::initializer_list(&local_88);
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)local_88._M_len;
  sVar1 = _::sum((_ *)local_88._M_array,nums_01);
  heapArray<kj::StringTree::Branch>(&local_78,sVar1);
  Array<kj::StringTree::Branch>::operator=(&in_RDI->branches,&local_78);
  Array<kj::StringTree::Branch>::~Array(&local_78);
  pos = String::begin(&in_RDI->text);
  fill(in_RDI,pos,0);
  return in_RDI;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}